

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O1

vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
* __thiscall
vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::InvariantInnerTriangleSetTestInstance::
genTessLevelCases(vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                  *__return_storage_ptr__,InvariantInnerTriangleSetTestInstance *this)

{
  pointer pTVar1;
  uint uVar2;
  int subNdx;
  int iVar3;
  ulong uVar4;
  long lVar5;
  float fVar6;
  LevelCase levelCase;
  TessLevels levels;
  vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  baseResults;
  Random rnd;
  value_type local_98;
  TessLevels local_78;
  pointer local_60;
  vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  local_58;
  deRandom local_40;
  
  InvarianceTestInstance::genTessLevelCases(&local_58,&this->super_InvarianceTestInstance);
  (__return_storage_ptr__->
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deRandom_init(&local_40,0x7b);
  local_60 = local_58.
             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
             ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (uint)((ulong)((long)local_58.
                               super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_58.
                              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5);
  if (0 < (int)uVar2) {
    uVar4 = 0;
    do {
      pTVar1 = local_60[uVar4].levels.
               super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_78.outer._8_8_ = *(undefined8 *)(pTVar1->outer + 2);
      local_78.inner = *&pTVar1->inner;
      local_78.outer._0_8_ = *(undefined8 *)pTVar1->outer;
      local_98.levels.
      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      local_98.levels.
      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      local_98.mem = 0;
      local_98.levels.
      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.levels.
      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_finish = (TessLevels *)0x0;
      iVar3 = 0;
      do {
        if (local_98.levels.
            super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (TessLevels *)
            CONCAT44(local_98.levels.
                     super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                     local_98.levels.
                     super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_)) {
          std::vector<vkt::tessellation::TessLevels,std::allocator<vkt::tessellation::TessLevels>>::
          _M_realloc_insert<vkt::tessellation::TessLevels_const&>
                    ((vector<vkt::tessellation::TessLevels,std::allocator<vkt::tessellation::TessLevels>>
                      *)&local_98,
                     (iterator)
                     local_98.levels.
                     super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_78);
        }
        else {
          *(undefined8 *)
           ((local_98.levels.
             super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
             ._M_impl.super__Vector_impl_data._M_finish)->outer + 2) = local_78.outer._8_8_;
          *&(local_98.levels.
             super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
             ._M_impl.super__Vector_impl_data._M_finish)->inner = local_78.inner;
          *(undefined8 *)
           (local_98.levels.
            super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
            ._M_impl.super__Vector_impl_data._M_finish)->outer = local_78.outer._0_8_;
          local_98.levels.
          super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_98.levels.
               super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        lVar5 = 2;
        do {
          fVar6 = deRandom_getFloat(&local_40);
          *(float *)((long)local_78.inner + lVar5 * 4) = fVar6 * 14.0 + 2.0;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 6);
        if ((this->super_InvarianceTestInstance).m_caseDef.primitiveType ==
            TESSPRIMITIVETYPE_TRIANGLES) {
          fVar6 = deRandom_getFloat(&local_40);
          local_78.inner[1] = fVar6 * 14.0 + 2.0;
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 != 4);
      std::
      vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
      ::push_back(__return_storage_ptr__,&local_98);
      if (local_98.levels.
          super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.levels.
                        super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        CONCAT44(local_98.levels.
                                 super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                 local_98.levels.
                                 super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                        (long)local_98.levels.
                              super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uVar2 & 0x7fffffff));
  }
  std::
  vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  ::~vector(&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::vector<LevelCase> genTessLevelCases (void) const
	{
		const int						numSubCases		= 4;
		const std::vector<LevelCase>	baseResults		= InvarianceTestInstance::genTessLevelCases();
		std::vector<LevelCase>			result;
		de::Random						rnd				(123);

		// Generate variants with different values for irrelevant levels.
		for (int baseNdx = 0; baseNdx < static_cast<int>(baseResults.size()); ++baseNdx)
		{
			const TessLevels&	base	= baseResults[baseNdx].levels[0];
			TessLevels			levels	= base;
			LevelCase			levelCase;

			for (int subNdx = 0; subNdx < numSubCases; ++subNdx)
			{
				levelCase.levels.push_back(levels);

				for (int i = 0; i < DE_LENGTH_OF_ARRAY(levels.outer); ++i)
					levels.outer[i] = rnd.getFloat(2.0f, 16.0f);
				if (m_caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
					levels.inner[1] = rnd.getFloat(2.0f, 16.0f);
			}

			result.push_back(levelCase);
		}

		return result;
	}